

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlXPathObjectPtr pxVar2;
  int n;
  xmlXPathObjectPtr needle;
  xmlXPathObjectPtr hay;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 2) {
      if (ctxt->valueNr < ctxt->valueFrame + 2) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING)) {
          xmlXPathErr(ctxt,0xb);
        }
        else {
          obj = valuePop(ctxt);
          if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
            xmlXPathStringFunction(ctxt,1);
          }
          obj_00 = valuePop(ctxt);
          if ((obj_00 == (xmlXPathObjectPtr)0x0) || (obj_00->type != XPATH_STRING)) {
            xmlXPathReleaseObject(ctxt->context,obj_00);
            xmlXPathReleaseObject(ctxt->context,obj);
            xmlXPathErr(ctxt,0xb);
          }
          else {
            iVar1 = xmlStrlen(obj->stringval);
            iVar1 = xmlStrncmp(obj_00->stringval,obj->stringval,iVar1);
            if (iVar1 == 0) {
              pxVar2 = xmlXPathCacheNewBoolean(ctxt->context,1);
              valuePush(ctxt,pxVar2);
            }
            else {
              pxVar2 = xmlXPathCacheNewBoolean(ctxt->context,0);
              valuePush(ctxt,pxVar2);
            }
            xmlXPathReleaseObject(ctxt->context,obj_00);
            xmlXPathReleaseObject(ctxt->context,obj);
          }
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;
    int n;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = valuePop(ctxt);
    CAST_TO_STRING;
    hay = valuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    n = xmlStrlen(needle->stringval);
    if (xmlStrncmp(hay->stringval, needle->stringval, n))
        valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, 0));
    else
        valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, 1));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}